

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTexture.cpp
# Opt level: O2

TextureCube *
glu::TextureCube::create
          (RenderContext *context,ContextInfo *contextInfo,Archive *archive,int numLevels,
          char **filenames)

{
  bool bVar1;
  TextureCube *this;
  TestError *this_00;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  TexDecompressionParams local_7c;
  RenderContext *local_78;
  vector<tcu::CompressedTexture,_std::allocator<tcu::CompressedTexture>_> levels;
  string ext;
  
  de::FilePath::FilePath((FilePath *)&levels,*filenames);
  de::FilePath::getFileExtension_abi_cxx11_(&ext,(FilePath *)&levels);
  local_78 = context;
  std::__cxx11::string::~string((string *)&levels);
  bVar1 = std::operator==(&ext,"pkm");
  if (bVar1) {
    uVar3 = numLevels * 6;
    std::vector<tcu::CompressedTexture,_std::allocator<tcu::CompressedTexture>_>::vector
              (&levels,(long)(int)uVar3,(allocator_type *)&local_7c);
    uVar2 = 0;
    uVar4 = (ulong)uVar3;
    if ((int)uVar3 < 1) {
      uVar4 = uVar2;
    }
    for (; uVar4 * 0x28 - uVar2 != 0; uVar2 = uVar2 + 0x28) {
      tcu::ImageIO::loadPKM
                ((CompressedTexture *)
                 ((long)&(levels.
                          super__Vector_base<tcu::CompressedTexture,_std::allocator<tcu::CompressedTexture>_>
                          ._M_impl.super__Vector_impl_data._M_start)->m_format + uVar2),archive,
                 *filenames);
      filenames = filenames + 1;
    }
    this = (TextureCube *)operator_new(0x180);
    local_7c.astcMode = ASTCMODE_LAST;
    TextureCube(this,local_78,contextInfo,numLevels,
                levels.
                super__Vector_base<tcu::CompressedTexture,_std::allocator<tcu::CompressedTexture>_>.
                _M_impl.super__Vector_impl_data._M_start,&local_7c);
    std::vector<tcu::CompressedTexture,_std::allocator<tcu::CompressedTexture>_>::~vector(&levels);
    std::__cxx11::string::~string((string *)&ext);
    return this;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Unsupported file format",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluTexture.cpp"
             ,0x1ca);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

TextureCube* TextureCube::create (const RenderContext& context, const ContextInfo& contextInfo, const tcu::Archive& archive, int numLevels, const char* const* filenames)
{
	DE_ASSERT(numLevels > 0);

	std::string ext = de::FilePath(filenames[0]).getFileExtension();

	// \todo [2011-11-21 pyry] Support PNG images.
	if (ext == "pkm")
	{
		// Compressed texture.
		int								numImages	= numLevels*tcu::CUBEFACE_LAST;
		vector<tcu::CompressedTexture>	levels		(numImages);

		for (int ndx = 0; ndx < numImages; ndx++)
			tcu::ImageIO::loadPKM(levels[ndx], archive, filenames[ndx]);

		return new TextureCube(context, contextInfo, numLevels, &levels[0]);
	}
	else
		TCU_FAIL("Unsupported file format");
}